

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O1

void __thiscall MingwMakefileGenerator::writeIncPart(MingwMakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  int *piVar2;
  int iVar3;
  ProStringList *objList;
  QTextStream *pQVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ProString *incit;
  ProString *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  bool ok;
  QRegularExpression local_100 [8];
  QString local_f8;
  QString local_d8;
  ProKey local_b8;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<(t,"INCPATH       = ");
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"INCLUDEPATH");
  objList = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
  piVar2 = (int *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_),2,
                 0x10);
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_78);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_88);
  lVar7 = (objList->super_QList<ProString>).d.size;
  if (lVar7 == 0) {
    iVar6 = 0;
  }
  else {
    lVar5 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + *(int *)((long)&((objList->super_QList<ProString>).d.ptr)->m_length + lVar5) +
              2;
      lVar5 = lVar5 + 0x30;
    } while (lVar7 * 0x30 != lVar5);
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_b8,"QMAKE_RESPONSEFILE_THRESHOLD");
  QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,&local_b8);
  if (local_68.m_length == 0) {
LAB_001e2fdd:
    iVar3 = 8000;
  }
  else {
    local_d8.d.d = (Data *)CONCAT71(local_d8.d.d._1_7_,0xaa);
    iVar3 = ProString::toInt(&local_68,(bool *)&local_d8,0);
    if ((char)local_d8.d.d == '\0') goto LAB_001e2fdd;
  }
  piVar2 = (int *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_),2,
                 0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (iVar3 < iVar6) {
    local_b8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar8.m_data = (storage_type *)0x7;
    QVar8.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar8);
    local_d8.d.d = (Data *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
    local_d8.d.ptr = local_68.m_string.d.ptr;
    local_d8.d.size = local_68.m_string.d.size;
    QVar9.m_data = (storage_type *)0x2;
    QVar9.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar9);
    local_f8.d.d = (Data *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
    local_f8.d.ptr = local_68.m_string.d.ptr;
    local_f8.d.size = local_68.m_string.d.size;
    MakefileGenerator::createResponseFile
              ((QString *)&local_b8,(MakefileGenerator *)this,&local_d8,objList,&local_f8);
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((undefined1 *)local_b8.super_ProString.m_string.d.size != (undefined1 *)0x0) {
      local_68.m_string.d.d._0_4_ = CONCAT31(local_68.m_string.d.d._1_3_,0x40);
      local_68.m_string.d.ptr = (char16_t *)&local_b8;
      operator<<(t,(QStringBuilder<char,_const_QString_&> *)&local_68);
      Qt::endl(t);
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_001e3364;
    }
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  lVar7 = (objList->super_QList<ProString>).d.size;
  if (lVar7 != 0) {
    this_00 = (objList->super_QList<ProString>).d.ptr;
    lVar7 = lVar7 * 0x30;
    do {
      local_b8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)&local_b8,this_00);
      QVar10.m_data = (storage_type *)0x3;
      QVar10.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar10);
      local_d8.d.d = (Data *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
      local_d8.d.ptr = local_68.m_string.d.ptr;
      local_d8.d.size = local_68.m_string.d.size;
      QRegularExpression::QRegularExpression(local_100,&local_d8,0);
      QVar11.m_data = (storage_type *)0x0;
      QVar11.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar11);
      local_f8.d.d = (Data *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
      local_f8.d.ptr = local_68.m_string.d.ptr;
      local_f8.d.size = local_68.m_string.d.size;
      QString::replace((QRegularExpression *)&local_b8,(QString *)local_100);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QRegularExpression::~QRegularExpression(local_100);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QString::replace((QChar)(char16_t)(QRegularExpression *)&local_b8,(QChar)0x5c,0x2f);
      pQVar4 = (QTextStream *)QTextStream::operator<<(t,"-I");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])(&local_68,this,(QRegularExpression *)&local_b8);
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&local_68);
      QTextStream::operator<<(pQVar4,(QChar)0x20);
      piVar2 = (int *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_68.m_string.d.d._4_4_,local_68.m_string.d.d._0_4_)
                     ,2,0x10);
        }
      }
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00 = this_00 + 1;
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != 0);
  }
  Qt::endl(t);
LAB_001e3364:
  QTextStream::~QTextStream((QTextStream *)&local_88);
  QFile::~QFile((QFile *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MingwMakefileGenerator::writeIncPart(QTextStream &t)
{
    t << "INCPATH       = ";

    const ProStringList &incs = project->values("INCLUDEPATH");
    QFile responseFile;
    QTextStream responseStream;
    QChar sep(' ');
    int totalLength = std::accumulate(incs.constBegin(), incs.constEnd(), 0,
                                      [](int total, const ProString &inc) {
        return total + inc.size() + 2;
    });
    if (totalLength > project->intValue("QMAKE_RESPONSEFILE_THRESHOLD", 8000)) {
        const QString fileName = createResponseFile("incpath", incs, "-I");
        if (!fileName.isEmpty()) {
            t << '@' + fileName;
            t << Qt::endl;
            return;
        }
    }
    for (const ProString &incit: std::as_const(incs)) {
        QString inc = incit.toQString();
        inc.replace(QRegularExpression("\\\\$"), "");
        inc.replace('\\', '/');
        t << "-I" << escapeFilePath(inc) << sep;
    }
    t << Qt::endl;
}